

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DatabaseSnapshot.cpp
# Opt level: O2

void __thiscall
DatabaseSnapshot::internal_compact
          (DatabaseSnapshot *this,Task *task,
          vector<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_> *datasets)

{
  pointer ppOVar1;
  string *__x;
  size_type __n;
  pointer ppOVar2;
  vector<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_> *__range1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ds_names;
  string dataset_name;
  DbChangeType local_1c0;
  allocator<char> local_1b9;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1b8;
  string local_1a0;
  string local_180;
  undefined1 local_160 [160];
  DBChange local_c0;
  DBChange local_78;
  
  local_1b8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1b8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1b8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  __n = (long)(datasets->
              super__Vector_base<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>).
              _M_impl.super__Vector_impl_data._M_finish -
        (long)(datasets->
              super__Vector_base<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>).
              _M_impl.super__Vector_impl_data._M_start >> 3;
  if (1 < __n) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::reserve(&local_1b8,__n);
    ppOVar1 = (datasets->
              super__Vector_base<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>).
              _M_impl.super__Vector_impl_data._M_finish;
    for (ppOVar2 = (datasets->
                   super__Vector_base<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>
                   )._M_impl.super__Vector_impl_data._M_start; ppOVar2 != ppOVar1;
        ppOVar2 = ppOVar2 + 1) {
      __x = OnDiskDataset::get_name_abi_cxx11_(*ppOVar2);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&local_1b8,__x);
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1a0,"set",(allocator<char> *)&local_1c0);
    allocate_name((DatabaseName *)local_160,this,&local_1a0);
    std::__cxx11::string::string((string *)&local_180,(string *)(local_160 + 0x80));
    DatabaseName::~DatabaseName((DatabaseName *)local_160);
    std::__cxx11::string::~string((string *)&local_1a0);
    OnDiskDataset::merge(&this->db_base,&local_180,datasets,*(TaskSpec **)task);
    ppOVar1 = (datasets->
              super__Vector_base<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>).
              _M_impl.super__Vector_impl_data._M_finish;
    for (ppOVar2 = (datasets->
                   super__Vector_base<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>
                   )._M_impl.super__Vector_impl_data._M_start; ppOVar2 != ppOVar1;
        ppOVar2 = ppOVar2 + 1) {
      local_1c0 = Drop;
      OnDiskDataset::get_id_abi_cxx11_((string *)local_160,*ppOVar2);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_1a0,"",&local_1b9);
      DBChange::DBChange(&local_78,&local_1c0,(string *)local_160,&local_1a0);
      std::vector<DBChange,_std::allocator<DBChange>_>::emplace_back<DBChange>
                ((vector<DBChange,_std::allocator<DBChange>_> *)(task + 8),&local_78);
      DBChange::~DBChange(&local_78);
      std::__cxx11::string::~string((string *)&local_1a0);
      std::__cxx11::string::~string((string *)local_160);
    }
    local_1a0._M_dataplus._M_p._0_4_ = 1;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_160,"",(allocator<char> *)&local_1c0);
    DBChange::DBChange(&local_c0,(DbChangeType *)&local_1a0,&local_180,(string *)local_160);
    std::vector<DBChange,_std::allocator<DBChange>_>::emplace_back<DBChange>
              ((vector<DBChange,_std::allocator<DBChange>_> *)(task + 8),&local_c0);
    DBChange::~DBChange(&local_c0);
    std::__cxx11::string::~string((string *)local_160);
    std::__cxx11::string::~string((string *)&local_180);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_1b8);
  return;
}

Assistant:

void DatabaseSnapshot::internal_compact(
    Task *task, const std::vector<const OnDiskDataset *> &datasets) const {
    std::vector<std::string> ds_names;

    // There's nothing to compact
    if (datasets.size() < 2) {
        return;
    }

    ds_names.reserve(datasets.size());
    for (const auto *ds : datasets) {
        ds_names.push_back(ds->get_name());
    }

    std::string dataset_name = allocate_name().get_filename();
    OnDiskDataset::merge(db_base, dataset_name, datasets, &task->spec());

    for (auto &dataset : datasets) {
        task->change(DBChange(DbChangeType::Drop, dataset->get_id()));
    }

    task->change(DBChange(DbChangeType::Insert, dataset_name));
}